

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TryCatchStatement.h
# Opt level: O0

void __thiscall TryCatchStatement::execute(TryCatchStatement *this,Environment *env)

{
  element_type *peVar1;
  Environment local_98;
  ThrowPacket *throwPacket;
  undefined1 local_50 [8];
  Environment local;
  Environment *env_local;
  TryCatchStatement *this_local;
  
  local.symbols._M_h._M_single_bucket = (__node_base_ptr)env;
  Environment::Environment((Environment *)local_50,env);
  peVar1 = std::__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<StatementBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->tryBlock);
  (**(peVar1->super_Statement)._vptr_Statement)(peVar1,local_50);
  Environment::~Environment((Environment *)local_50);
  return;
}

Assistant:

void execute(Environment *env) override {
        try {
            Environment local = *env;
            tryBlock -> execute(&local);
        } catch(ThrowPacket& throwPacket) {
            Environment local = *env;
            if(!ident.empty())
                local.putValue(ident, Scope::Public, throwPacket.getValue(), false);
            catchBlock -> execute(&local);
        }
    }